

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xwinman.c
# Opt level: O1

void process_Xevents(DspInterface dsp)

{
  uint uVar1;
  uint uVar2;
  DspInterface pDVar3;
  int iVar4;
  Cursor *pCVar5;
  Window WVar6;
  Cursor CVar7;
  uint uVar8;
  uint uVar9;
  Display *pDVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  XEvent report;
  XButtonEvent local_f0 [2];
  
  iVar4 = XPending(dsp->display_id);
  do {
    if (iVar4 == 0) {
      return;
    }
    XNextEvent(dsp->display_id,local_f0);
    pDVar3 = currentdsp;
    WVar6 = dsp->DisplayWindow;
    if (local_f0[0].window == WVar6) {
      if (local_f0[0].type == 0xc) {
        (*dsp->bitblt_to_screen)
                  (dsp,(DLword *)0x0,(dsp->Visible).x + (int)local_f0[0].root,
                   (dsp->Visible).y + local_f0[0].root._4_4_,(int)local_f0[0].subwindow,
                   local_f0[0].subwindow._4_4_);
      }
LAB_001426f5:
      XFlush(dsp->display_id);
    }
    else {
      if (local_f0[0].window == dsp->LispWindow) {
        if (local_f0[0].type == 7) {
          XSelectInput(currentdsp->display_id,currentdsp->DisplayWindow,currentdsp->EnableEventMask)
          ;
          XFlush(pDVar3->display_id);
        }
        else if (local_f0[0].type == 0x16) {
          uVar1 = dsp->ScrollBarWidth;
          uVar2 = dsp->InternalBorderWidth;
          iVar4 = uVar1 + uVar2 * 2;
          uVar8 = (dsp->Display).width + iVar4;
          if ((uint)local_f0[0].time < uVar8) {
            uVar8 = (uint)local_f0[0].time;
          }
          uVar9 = uVar1 + uVar2 * 2 + 2;
          if ((uint)local_f0[0].time <= uVar9) {
            uVar8 = uVar9;
          }
          uVar8 = uVar8 - iVar4;
          (dsp->Visible).width = uVar8;
          uVar11 = (dsp->Display).height + iVar4;
          if (local_f0[0].time._4_4_ < uVar11) {
            uVar11 = local_f0[0].time._4_4_;
          }
          if (local_f0[0].time._4_4_ <= uVar9) {
            uVar11 = uVar9;
          }
          uVar11 = uVar11 - iVar4;
          (dsp->Visible).height = uVar11;
          XMoveResizeWindow(dsp->display_id,WVar6,0,0,uVar8,uVar11);
          if (noscroll == 0) {
            uVar9 = (uVar1 >> 1) + uVar2 & 0x7fffffff;
            iVar4 = uVar11 + uVar9;
            iVar12 = uVar9 + uVar8;
            iVar13 = (uVar1 >> 1) - uVar2;
            XMoveResizeWindow(dsp->display_id,dsp->VerScrollBar,uVar8,-dsp->InternalBorderWidth,
                              dsp->ScrollBarWidth,(dsp->Visible).height);
            XMoveResizeWindow(dsp->display_id,dsp->HorScrollBar,-dsp->InternalBorderWidth,uVar11,
                              (dsp->Visible).width,dsp->ScrollBarWidth);
            uVar1 = (dsp->Visible).width;
            uVar2 = (dsp->Display).width;
            XMoveResizeWindow(dsp->display_id,dsp->HorScrollButton,
                              (long)(int)((dsp->Visible).x * uVar1) / (long)(int)uVar2 & 0xffffffff,
                              -dsp->InternalBorderWidth,(uVar1 * uVar1) / uVar2 + 1,
                              dsp->ScrollBarWidth);
            uVar1 = (dsp->Visible).height;
            uVar2 = (dsp->Display).height;
            XMoveResizeWindow(dsp->display_id,dsp->VerScrollButton,-dsp->InternalBorderWidth,
                              (long)(int)((dsp->Visible).y * uVar1) / (long)(int)uVar2 & 0xffffffff,
                              dsp->ScrollBarWidth,(uVar1 * uVar1) / uVar2 + 1);
            XMoveResizeWindow(dsp->display_id,dsp->NWGrav,uVar8,uVar11,iVar13,iVar13);
            XMoveResizeWindow(dsp->display_id,dsp->NEGrav,iVar12,uVar11,iVar13,iVar13);
            XMoveResizeWindow(dsp->display_id,dsp->SEGrav,iVar12,iVar4,iVar13,iVar13);
            XMoveResizeWindow(dsp->display_id,dsp->SWGrav,uVar8,iVar4,iVar13,iVar13);
            Scroll(dsp,(dsp->Visible).x,(dsp->Visible).y);
          }
          XFlush(dsp->display_id);
        }
        goto LAB_001426f5;
      }
      if (noscroll == 0) {
        WVar6 = dsp->HorScrollBar;
        if (local_f0[0].window == WVar6) {
          if (local_f0[0].type == 5) {
            if (local_f0[0].button == 3) {
LAB_001425c6:
              pDVar10 = dsp->display_id;
            }
            else {
              if (local_f0[0].button != 2) {
                if (local_f0[0].button != 1) goto LAB_001426f5;
                goto LAB_001425c6;
              }
              JumpScrollHor(dsp,local_f0[0].x);
              pDVar10 = dsp->display_id;
            }
            pCVar5 = &HorizScrollCursor;
            goto LAB_001426ed;
          }
          if (local_f0[0].type != 4) goto LAB_001426f5;
          if (local_f0[0].button == 3) {
            XDefineCursor(dsp->display_id,WVar6,ScrollRightCursor);
            ScrollRight(dsp);
            goto LAB_001426f5;
          }
          if (local_f0[0].button != 2) {
            if (local_f0[0].button == 1) {
              XDefineCursor(dsp->display_id,WVar6,ScrollLeftCursor);
              ScrollLeft(dsp);
            }
            goto LAB_001426f5;
          }
          pDVar10 = dsp->display_id;
          CVar7 = HorizThumbCursor;
        }
        else {
          if (local_f0[0].window != dsp->VerScrollBar) {
            WVar6 = dsp->NEGrav;
            if ((local_f0[0].type == 4 && local_f0[0].window == WVar6) &&
               ((char)local_f0[0].button == '\x01')) {
              iVar4 = 3;
            }
            else {
              WVar6 = dsp->SEGrav;
              if ((local_f0[0].window == WVar6 && local_f0[0].type == 4) &&
                 ((char)local_f0[0].button == '\x01')) {
                iVar4 = 9;
              }
              else {
                WVar6 = dsp->SWGrav;
                if ((local_f0[0].window == WVar6 && local_f0[0].type == 4) &&
                   ((char)local_f0[0].button == '\x01')) {
                  iVar4 = 7;
                }
                else {
                  WVar6 = dsp->NWGrav;
                  if ((local_f0[0].window != WVar6 || local_f0[0].type != 4) ||
                     ((char)local_f0[0].button != '\x01')) goto LAB_001426f5;
                  iVar4 = 1;
                }
              }
            }
            Set_BitGravity(local_f0,dsp,WVar6,iVar4);
            goto LAB_001426f5;
          }
          if (local_f0[0].type != 5) {
            if (local_f0[0].type == 4) {
              if (local_f0[0].button != 3) {
                if (local_f0[0].button != 2) {
                  if (local_f0[0].button == 1) {
                    XDefineCursor(dsp->display_id,local_f0[0].window,ScrollUpCursor);
                    ScrollUp(dsp);
                  }
                  goto LAB_001426f5;
                }
                pDVar10 = dsp->display_id;
                pCVar5 = &VertThumbCursor;
                goto LAB_001426ed;
              }
              XDefineCursor(dsp->display_id,local_f0[0].window,ScrollDownCursor);
              ScrollDown(dsp);
            }
            goto LAB_001426f5;
          }
          if (local_f0[0].button == 3) {
LAB_00142658:
            pDVar10 = dsp->display_id;
          }
          else {
            if (local_f0[0].button != 2) {
              if (local_f0[0].button != 1) goto LAB_001426f5;
              goto LAB_00142658;
            }
            JumpScrollVer(dsp,local_f0[0].y);
            pDVar10 = dsp->display_id;
          }
          pCVar5 = &VertScrollCursor;
LAB_001426ed:
          CVar7 = *pCVar5;
          WVar6 = local_f0[0].window;
        }
        XDefineCursor(pDVar10,WVar6,CVar7);
        goto LAB_001426f5;
      }
    }
    iVar4 = XPending(dsp->display_id);
  } while( true );
}

Assistant:

void process_Xevents(DspInterface dsp)
{
  XEvent report;

  while (XPending(dsp->display_id)) {
    XNextEvent(dsp->display_id, &report);
    if (report.xany.window == dsp->DisplayWindow) /* Try the most important window first. */
      switch (report.type) {
#ifndef INIT
        case MotionNotify:
          *CLastUserActionCell68k = MiscStats->secondstmp;
          *EmCursorX68K = (*((DLword *)EmMouseX68K)) =
              (short)((report.xmotion.x + dsp->Visible.x) & 0xFFFF) - Current_Hot_X;
          *EmCursorY68K = (*((DLword *)EmMouseY68K)) =
              (short)((report.xmotion.y + dsp->Visible.y) & 0xFFFF) - Current_Hot_Y;
          break;
        case KeyPress:
          kb_trans(SUNLispKeyMap[(report.xkey.keycode) - KEYCODE_OFFSET], FALSE);
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case KeyRelease:
          kb_trans(SUNLispKeyMap[(report.xkey.keycode) - KEYCODE_OFFSET], TRUE);
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_LEFT, FALSE); break;
            case Button2: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_MIDDLE, FALSE); break;
            case Button3: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_RIGHT, FALSE); break;
            case Button4: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFT, FALSE); break;
            case Button5: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFTMIDDLE, FALSE); break;
            case Button5 + 1: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHT, FALSE); break;
            case Button5 + 2: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHTMIDDLE, FALSE); break;
            default: break;
          }
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_LEFT, TRUE); break;
            case Button2: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_MIDDLE, TRUE); break;
            case Button3: PUTBASEBIT68K(EmRealUtilin68K, MOUSE_RIGHT, TRUE); break;
            case Button4: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFT, TRUE); break;
            case Button5: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_LEFTMIDDLE, TRUE); break;
            case Button5 + 1: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHT, TRUE); break;
            case Button5 + 2: PUTBASEBIT68K(EmRealUtilin68K, KEYSET_RIGHTMIDDLE, TRUE); break;
            default: break;
          }
          DoRing();
          if ((KBDEventFlg += 1) > 0) Irq_Stk_End = Irq_Stk_Check = 0;
          break;
        case EnterNotify: Mouse_Included = TRUE; break;
        case LeaveNotify: Mouse_Included = FALSE; break;
#endif
        case Expose:
          (dsp->bitblt_to_screen)(dsp, 0, report.xexpose.x + dsp->Visible.x,
                                  report.xexpose.y + dsp->Visible.y, report.xexpose.width,
                                  report.xexpose.height);
          break;
        default: break;
      }
    else if (report.xany.window == dsp->LispWindow)
      switch (report.xany.type) {
        case ConfigureNotify:
          lisp_Xconfigure(dsp, report.xconfigure.x, report.xconfigure.y, (unsigned)report.xconfigure.width,
                          (unsigned)report.xconfigure.height);
          break;
        case EnterNotify: enable_Xkeyboard(currentdsp); break;
        case LeaveNotify: break;
        case MapNotify:
          /* Turn the blitting to the screen on */
          break;
        case UnmapNotify:
          /* Turn the blitting to the screen off */
          break;
        default: break;
      }
    else if (noscroll) continue;
    else if (report.xany.window == dsp->HorScrollBar)
      switch (report.type) {
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, dsp->HorScrollBar, &ScrollLeftCursor);
              ScrollLeft(dsp);
              break;
            case Button2:
              DefineCursor(dsp, dsp->HorScrollBar, &HorizThumbCursor);
              break;
            case Button3:
              DefineCursor(dsp, dsp->HorScrollBar, &ScrollRightCursor);
              ScrollRight(dsp);
              break;
            default: break;
          } /* end switch */
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            case Button2:
              JumpScrollHor(dsp, report.xbutton.x);
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &HorizScrollCursor);
              break;
            default: break;
          } /* end switch */
	  break;
        default: break;
      }
    else if (report.xany.window == dsp->VerScrollBar)
      switch (report.type) {
        case ButtonPress:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &ScrollUpCursor);
              ScrollUp(dsp);
              break;
            case Button2:
              DefineCursor(dsp, report.xany.window, &VertThumbCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &ScrollDownCursor);
              ScrollDown(dsp);
              break;
            default: break;
          } /* end switch */
          break;
        case ButtonRelease:
          switch (report.xbutton.button) {
            case Button1:
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            case Button3:
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            case Button2:
              JumpScrollVer(dsp, report.xbutton.y);
              DefineCursor(dsp, report.xany.window, &VertScrollCursor);
              break;
            default: break;
          } /* end switch */
          break;
        default: break;
      }
    else if ((report.xany.window == dsp->NEGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->NEGrav, NorthEastGravity);
    else if ((report.xany.window == dsp->SEGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->SEGrav, SouthEastGravity);
    else if ((report.xany.window == dsp->SWGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->SWGrav, SouthWestGravity);
    else if ((report.xany.window == dsp->NWGrav) && (report.xany.type == ButtonPress) &&
             ((report.xbutton.button & 0xFF) == Button1))
      Set_BitGravity(&report.xbutton, dsp, dsp->NWGrav, NorthWestGravity);
    XFlush(dsp->display_id);
  } /* end while */
}